

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void OpenSteer::OpenSteerDemo::drawCircleHighlightOnVehicle
               (AbstractVehicle *v,float radiusMultiplier,Color *color)

{
  long *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float radius;
  Vec3 VVar2;
  Vec3 *cPosition;
  Color *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58 [16];
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  undefined8 *local_20;
  float local_c;
  long *local_8;
  
  if (in_RDI != (long *)0x0) {
    local_c = in_XMM0_Da;
    local_8 = in_RDI;
    VVar2 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::position(&camera.super_LocalSpace);
    local_38 = VVar2.z;
    local_28 = local_38;
    local_40 = VVar2._0_8_;
    local_30 = local_40;
    local_20 = &local_30;
    fVar1 = (float)(**(code **)(*local_8 + 0xc0))();
    fVar1 = fVar1 * local_c;
    (**(code **)(*local_8 + 0x40))();
    (**(code **)(*local_8 + 0x40))();
    VVar2 = Vec3::operator-(in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_);
    draw3dCircle(radius,VVar2._0_8_,(Vec3 *)CONCAT44(fVar1,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,0);
  }
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::drawCircleHighlightOnVehicle (const AbstractVehicle* v,
                                                  const float radiusMultiplier,
                                                  const Color& color)
{
    if (v)
    {
        const Vec3& cPosition = camera.position();
        draw3dCircle  (v->radius() * radiusMultiplier,  // adjusted radius
                       v->position(),                   // center
                       v->position() - cPosition,       // view axis
                       color,                          // drawing color
                       20);                            // circle segments
    }
}